

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_factory.cc
# Opt level: O0

unique_ptr<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
sentencepiece::ModelFactory::Create(ModelProto *model_proto)

{
  TrainerSpec_ModelType TVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  __uniq_ptr_data<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>,_true,_true>
  in_RDI;
  TrainerSpec *trainer_spec;
  char *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  unique_ptr<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
  *in_stack_ffffffffffffff50;
  ModelProto *in_stack_ffffffffffffff58;
  Die local_39 [33];
  TrainerSpec *local_18;
  
  local_18 = ModelProto::trainer_spec((ModelProto *)0x46b161);
  TVar1 = TrainerSpec::model_type((TrainerSpec *)0x46b176);
  switch(TVar1) {
  case TrainerSpec_ModelType_UNIGRAM:
    std::make_unique<sentencepiece::unigram::Model,sentencepiece::ModelProto_const&>
              (in_stack_ffffffffffffff58);
    std::
    unique_ptr<sentencepiece::ModelInterface,std::default_delete<sentencepiece::ModelInterface>>::
    unique_ptr<sentencepiece::unigram::Model,std::default_delete<sentencepiece::unigram::Model>,void>
              (in_stack_ffffffffffffff50,
               (unique_ptr<sentencepiece::unigram::Model,_std::default_delete<sentencepiece::unigram::Model>_>
                *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::
    unique_ptr<sentencepiece::unigram::Model,_std::default_delete<sentencepiece::unigram::Model>_>::
    ~unique_ptr((unique_ptr<sentencepiece::unigram::Model,_std::default_delete<sentencepiece::unigram::Model>_>
                 *)in_stack_ffffffffffffff40);
    break;
  case TrainerSpec_ModelType_BPE:
    std::make_unique<sentencepiece::bpe::Model,sentencepiece::ModelProto_const&>
              (in_stack_ffffffffffffff58);
    std::
    unique_ptr<sentencepiece::ModelInterface,std::default_delete<sentencepiece::ModelInterface>>::
    unique_ptr<sentencepiece::bpe::Model,std::default_delete<sentencepiece::bpe::Model>,void>
              (in_stack_ffffffffffffff50,
               (unique_ptr<sentencepiece::bpe::Model,_std::default_delete<sentencepiece::bpe::Model>_>
                *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::unique_ptr<sentencepiece::bpe::Model,_std::default_delete<sentencepiece::bpe::Model>_>::
    ~unique_ptr((unique_ptr<sentencepiece::bpe::Model,_std::default_delete<sentencepiece::bpe::Model>_>
                 *)in_stack_ffffffffffffff40);
    break;
  case TrainerSpec_ModelType_WORD:
    std::make_unique<sentencepiece::word::Model,sentencepiece::ModelProto_const&>
              (in_stack_ffffffffffffff58);
    std::
    unique_ptr<sentencepiece::ModelInterface,std::default_delete<sentencepiece::ModelInterface>>::
    unique_ptr<sentencepiece::word::Model,std::default_delete<sentencepiece::word::Model>,void>
              (in_stack_ffffffffffffff50,
               (unique_ptr<sentencepiece::word::Model,_std::default_delete<sentencepiece::word::Model>_>
                *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::unique_ptr<sentencepiece::word::Model,_std::default_delete<sentencepiece::word::Model>_>::
    ~unique_ptr((unique_ptr<sentencepiece::word::Model,_std::default_delete<sentencepiece::word::Model>_>
                 *)in_stack_ffffffffffffff40);
    break;
  case TrainerSpec_ModelType_CHAR:
    std::make_unique<sentencepiece::character::Model,sentencepiece::ModelProto_const&>
              (in_stack_ffffffffffffff58);
    std::
    unique_ptr<sentencepiece::ModelInterface,std::default_delete<sentencepiece::ModelInterface>>::
    unique_ptr<sentencepiece::character::Model,std::default_delete<sentencepiece::character::Model>,void>
              (in_stack_ffffffffffffff50,
               (unique_ptr<sentencepiece::character::Model,_std::default_delete<sentencepiece::character::Model>_>
                *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::
    unique_ptr<sentencepiece::character::Model,_std::default_delete<sentencepiece::character::Model>_>
    ::~unique_ptr((unique_ptr<sentencepiece::character::Model,_std::default_delete<sentencepiece::character::Model>_>
                   *)in_stack_ffffffffffffff40);
    break;
  default:
    iVar2 = logging::GetMinLogLevel();
    if (iVar2 < 3) {
      error::Die::Die(local_39,false);
      pcVar3 = logging::BaseName(in_stack_ffffffffffffff38);
      poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2b);
      poVar4 = std::operator<<(poVar4,") ");
      poVar4 = std::operator<<(poVar4,"LOG(");
      poVar4 = std::operator<<(poVar4,"ERROR");
      poVar4 = std::operator<<(poVar4,") ");
      poVar4 = std::operator<<(poVar4,"Unknown model_type: ");
      TVar1 = TrainerSpec::model_type((TrainerSpec *)0x46b38d);
      in_stack_ffffffffffffff40 = (ostream *)std::ostream::operator<<(poVar4,TVar1);
      error::Die::operator&(local_39,in_stack_ffffffffffffff40);
      error::Die::~Die((Die *)in_stack_ffffffffffffff40);
    }
    std::
    unique_ptr<sentencepiece::ModelInterface,std::default_delete<sentencepiece::ModelInterface>>::
    unique_ptr<std::default_delete<sentencepiece::ModelInterface>,void>
              ((unique_ptr<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
                *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return (__uniq_ptr_data<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>,_true,_true>
          )(tuple<sentencepiece::ModelInterface_*,_std::default_delete<sentencepiece::ModelInterface>_>
            )in_RDI.
             super___uniq_ptr_impl<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::ModelInterface_*,_std::default_delete<sentencepiece::ModelInterface>_>
             .super__Head_base<0UL,_sentencepiece::ModelInterface_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<ModelInterface> ModelFactory::Create(
    const ModelProto& model_proto) {
  const auto& trainer_spec = model_proto.trainer_spec();

  switch (trainer_spec.model_type()) {
    case TrainerSpec::UNIGRAM:
      return std::make_unique<unigram::Model>(model_proto);
      break;
    case TrainerSpec::BPE:
      return std::make_unique<bpe::Model>(model_proto);
      break;
    case TrainerSpec::WORD:
      return std::make_unique<word::Model>(model_proto);
      break;
    case TrainerSpec::CHAR:
      return std::make_unique<character::Model>(model_proto);
      break;
    default:
      LOG(ERROR) << "Unknown model_type: " << trainer_spec.model_type();
      return nullptr;
      break;
  }

  return std::make_unique<unigram::Model>(model_proto);
}